

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::Decode(GridAxisIrregular *this,KDataStream *stream)

{
  ushort uVar1;
  KUINT16 KVar2;
  KException *this_00;
  KDataStream *this_01;
  byte local_54;
  ushort local_52;
  unsigned_short local_50;
  undefined1 local_4d;
  KUINT8 i_1;
  KUINT8 NumPadding;
  KUINT16 i;
  KUINT16 ui16TmpVal;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GridAxisIrregular *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar2 = KDataStream::GetBufferSize(stream);
  if (KVar2 < 0x28) {
    local_4d = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    local_4d = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_vXiValues);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_vui16Padding);
  GridAxisRegular::Decode(&this->super_GridAxisRegular,local_18);
  this_01 = KDataStream::operator>>(local_18,(double *)&this->m_f64CoordScaleXi);
  KDataStream::operator>>(this_01,(double *)&this->m_f64CoordOffsetXi);
  local_50 = 0;
  for (local_52 = 0; local_52 < (this->super_GridAxisRegular).m_ui16NumPoints;
      local_52 = local_52 + 1) {
    KDataStream::operator>>(local_18,&local_50);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vXiValues,&local_50);
  }
  uVar1 = (this->super_GridAxisRegular).m_ui16NumPoints;
  for (local_54 = 0; local_54 < (byte)((ulong)uVar1 % 4); local_54 = local_54 + 1) {
    KDataStream::operator>>(local_18,&local_50);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16Padding,&local_50);
  }
  return;
}

Assistant:

void GridAxisIrregular::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_AXIS_IRREGULAR )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vXiValues.clear();
    m_vui16Padding.clear();

    GridAxisRegular::Decode( stream );

    stream >> m_f64CoordScaleXi
           >> m_f64CoordOffsetXi;

    KUINT16 ui16TmpVal = 0;
    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        stream >> ui16TmpVal;
        m_vXiValues.push_back( ui16TmpVal );
    }

    // Calculate the padding that needs to be extracted. 64 bit boundary
    KUINT8 NumPadding = m_ui16NumPoints % 4;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        stream >> ui16TmpVal;
        m_vui16Padding.push_back( ui16TmpVal );
    }
}